

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint32_t FNV1A_Pippip_Yurii(char *key,int wrdlen,uint32_t seed)

{
  sbyte sVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  
  uVar2 = (ulong)seed ^ 0xcbf29ce484222325;
  if (wrdlen < 9) {
    bVar4 = (byte)(wrdlen << 3);
    sVar1 = (bVar4 < 0x41) * ('@' - bVar4);
    uVar2 = ((ulong)(*(long *)key << sVar1) >> sVar1 ^ uVar2) * 0x23462239;
  }
  else {
    uVar5 = wrdlen - 1U >> 4;
    uVar3 = (ulong)(uVar5 + 1);
    do {
      uVar2 = ((uVar2 ^ *(ulong *)key) * 0x23462239 ^
              *(ulong *)((long)key + ((ulong)(uint)wrdlen - (ulong)(uVar5 * 8 + 8)))) * 0x23462239;
      key = (char *)((long)key + 8);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar5 = (uint)(uVar2 >> 0x20) ^ (uint)uVar2;
  return uVar5 >> 0x10 ^ uVar5;
}

Assistant:

uint32_t
FNV1A_Pippip_Yurii(const char *key, int wrdlen, uint32_t seed)
{
#define _PADr_KAZE(x, n) ( ((x) << (n))>>(n) )
  const char *str = (char *)key;
  const uint32_t PRIME = 591798841;
  uint32_t hash32;
  uint64_t hash64 = (uint64_t)seed ^ UINT64_C(14695981039346656037);
  size_t Cycles, NDhead;
  if (wrdlen > 8) {
    Cycles = ((wrdlen - 1) >> 4) + 1;
    NDhead = wrdlen - (Cycles << 3);
#pragma nounroll
    for (; Cycles--; str += 8) {
      hash64 = (hash64 ^ (*(uint64_t *)(str))) * PRIME;
      hash64 = (hash64 ^ (*(uint64_t *)(str + NDhead))) * PRIME;
    }
  } else {
    hash64 = (hash64 ^ _PADr_KAZE(*(uint64_t *)(str + 0), (8 - wrdlen) << 3)) *
             PRIME;
  }
  hash32 = (uint32_t)(hash64 ^ (hash64 >> 32));
  return hash32 ^ (hash32 >> 16);
#undef _PADr_KAZE
}